

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

void cork_io_stream(cubeb_stream_conflict *stm,pa_stream *io_stream,cork_state state)

{
  pa_operation *stream;
  uint in_EDX;
  pa_stream *in_RSI;
  void *in_RDI;
  pa_operation *o;
  pa_operation *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((in_RSI != (pa_stream *)0x0) &&
     (stream = (*cubeb_pa_stream_cork)(in_RSI,in_EDX & 1,stream_success_callback,in_RDI),
     stream != (pa_operation *)0x0)) {
    operation_wait((cubeb_conflict *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(pa_stream *)stream,
                   in_stack_ffffffffffffffd8);
    (*cubeb_pa_operation_unref)(stream);
  }
  return;
}

Assistant:

static void
cork_io_stream(cubeb_stream * stm, pa_stream * io_stream, enum cork_state state)
{
  pa_operation * o;
  if (!io_stream) {
    return;
  }
  o = WRAP(pa_stream_cork)(io_stream, state & CORK, stream_success_callback,
                           stm);
  if (o) {
    operation_wait(stm->context, io_stream, o);
    WRAP(pa_operation_unref)(o);
  }
}